

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode Guid_encodeBinary(UA_Guid *src,UA_DataType *_)

{
  uint uVar1;
  UA_StatusCode UVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = 0x80080000;
  if (end < pos + 4) {
    uVar3 = 0x80080000;
  }
  else {
    *(UA_UInt32 *)pos = src->data1;
    pos = pos + 4;
    uVar3 = 0;
  }
  if (pos + 2 <= end) {
    *(UA_UInt16 *)pos = src->data2;
    pos = pos + 2;
    uVar1 = 0;
  }
  UVar2 = 0x80080000;
  if (end < pos + 2) {
    uVar4 = 0x80080000;
  }
  else {
    *(UA_UInt16 *)pos = src->data3;
    pos = pos + 2;
    uVar4 = 0;
  }
  if (pos + 8 <= end) {
    UVar2 = uVar1 | uVar3 | uVar4;
    *(undefined8 *)pos = *(undefined8 *)src->data4;
    pos = pos + 8;
  }
  return UVar2;
}

Assistant:

static UA_StatusCode
Guid_encodeBinary(UA_Guid const *src, const UA_DataType *_) {
    UA_StatusCode retval = UInt32_encodeBinary(&src->data1, NULL);
    retval |= UInt16_encodeBinary(&src->data2, NULL);
    retval |= UInt16_encodeBinary(&src->data3, NULL);
    if(pos + (8*sizeof(UA_Byte)) > end)
        return UA_STATUSCODE_BADENCODINGLIMITSEXCEEDED;
    memcpy(pos, src->data4, 8*sizeof(UA_Byte));
    pos += 8;
    return retval;
}